

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenEnum
          (PythonGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  EnumVal *ev;
  pointer ppEVar1;
  
  if ((enum_def->super_Definition).generated == false) {
    GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,
               (CommentConfig *)(anonymous_namespace)::def_comment,"");
    BeginEnum(this,enum_def,code_ptr);
    for (ppEVar1 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar1 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
      ev = *ppEVar1;
      GenComment(&ev->doc_comment,code_ptr,(CommentConfig *)(anonymous_namespace)::def_comment,
                 (anonymous_namespace)::Indent_abi_cxx11_);
      EnumMember(this,enum_def,ev,code_ptr);
    }
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def, std::string *code_ptr) const {
    if (enum_def.generated) return;

    GenComment(enum_def.doc_comment, code_ptr, &def_comment);
    BeginEnum(enum_def, code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, code_ptr, &def_comment, Indent.c_str());
      EnumMember(enum_def, ev, code_ptr);
    }
  }